

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_create_from_sparse(Integer s_a,Integer trans)

{
  long lVar1;
  size_t __n;
  _sparse_array *p_Var2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  Integer IVar6;
  Integer IVar7;
  Integer *mapc;
  long lVar8;
  logical lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Integer IVar16;
  long lVar17;
  uint uVar18;
  bool bVar19;
  Integer lo [2];
  Integer ld;
  long local_e0;
  int local_d8;
  char plus [2];
  void *g_data;
  long local_a8;
  long local_a0;
  Integer local_98;
  long local_90;
  Integer local_88;
  void *jptr;
  void *iptr;
  void *s_data;
  Integer jhi;
  Integer jlo;
  Integer nblock [2];
  Integer dims [2];
  
  lVar1 = s_a + 1000;
  local_98 = s_a;
  IVar6 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  IVar7 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  local_88 = SPA[lVar1].idx_size;
  __n = SPA[lVar1].size;
  bVar19 = _ga_sync_begin != 0;
  local_d8 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar19) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  mapc = (Integer *)malloc(IVar6 * 8 + 8);
  for (lVar8 = 0; p_Var2 = SPA, lVar8 <= IVar6; lVar8 = lVar8 + 1) {
    mapc[lVar8] = 0;
  }
  mapc[IVar7 + 1] = SPA[lVar1].ilo + 1;
  plus[0] = '+';
  plus[1] = '\0';
  pnga_pgroup_gop(p_Var2[lVar1].grp,0x3ea,mapc,IVar6 + 1,plus);
  lVar8 = 0;
  if (trans == 0) {
    lVar8 = IVar6;
  }
  mapc[lVar8] = 1;
  IVar16 = IVar6;
  IVar7 = 1;
  if (trans == 0) {
    IVar16 = 1;
    IVar7 = IVar6;
  }
  IVar6 = pnga_create_handle();
  dims[0] = SPA[lVar1].idim;
  dims[1] = SPA[lVar1].jdim;
  pnga_set_data(IVar6,2,dims,SPA[lVar1].type);
  nblock[0] = IVar7;
  nblock[1] = IVar16;
  pnga_set_irreg_distr(IVar6,mapc,nblock);
  lVar9 = pnga_allocate(IVar6);
  if (lVar9 == 0) {
    pnga_error("(ga_sprs_array_create_from_sparse) failed to create dense array",0);
  }
  free(mapc);
  pnga_zero(IVar6);
  local_e0 = SPA[lVar1].ilo;
  lVar8 = SPA[lVar1].ihi;
  if (trans == 0) {
    lo[0] = local_e0 + 1;
    local_a8 = lVar8 + 1;
    lo[1] = 1;
    local_a0 = SPA[lVar1].jdim;
  }
  else {
    lo[0] = 1;
    local_a8 = SPA[lVar1].idim;
    lo[1] = local_e0 + 1;
    local_a0 = lVar8 + 1;
  }
  pnga_access_ptr(IVar6,lo,&local_a8,&g_data,&ld);
  lVar10 = 0;
  while (IVar7 = local_98, lVar10 < SPA[lVar1].nblocks) {
    IVar16 = SPA[lVar1].blkidx[lVar10];
    local_90 = lVar10;
    pnga_sprs_array_column_distribution(local_98,IVar16,&jlo,&jhi);
    pnga_sprs_array_access_col_block(IVar7,IVar16,&iptr,&jptr,&s_data);
    pvVar5 = s_data;
    pvVar4 = iptr;
    pvVar3 = jptr;
    lVar10 = local_e0;
    while (lVar10 <= lVar8) {
      lVar17 = lVar10 - local_e0;
      lVar10 = lVar10 + 1;
      if (local_88 == 4) {
        uVar18 = *(int *)((long)pvVar4 + lVar17 * 4 + 4) - *(int *)((long)pvVar4 + lVar17 * 4);
        if ((int)uVar18 < 1) {
          uVar18 = 0;
        }
        for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
          lVar12 = (long)*(int *)((long)pvVar4 + lVar17 * 4) + uVar11;
          lVar14 = (long)*(int *)((long)pvVar3 + lVar12 * 4);
          if (trans == 0) {
            lVar14 = ((lVar14 - lo[1]) + 1) * ld + (lVar10 - lo[0]);
          }
          else {
            lVar14 = ((lVar14 + (lVar10 - lo[1]) * ld) - lo[0]) + 1;
          }
          memcpy((void *)(lVar14 * __n + (long)g_data),(void *)(lVar12 * __n + (long)pvVar5),__n);
        }
      }
      else {
        lVar12 = *(long *)((long)pvVar4 + lVar17 * 8 + 8) - *(long *)((long)pvVar4 + lVar17 * 8);
        if (lVar12 < 1) {
          lVar12 = 0;
        }
        for (lVar14 = 0; lVar12 != lVar14; lVar14 = lVar14 + 1) {
          lVar13 = *(long *)((long)pvVar4 + lVar17 * 8) + lVar14;
          lVar15 = *(long *)((long)pvVar3 + lVar13 * 8);
          if (trans == 0) {
            lVar15 = ((lVar15 - lo[1]) + 1) * ld + (lVar10 - lo[0]);
          }
          else {
            lVar15 = ((lVar15 + (lVar10 - lo[1]) * ld) - lo[0]) + 1;
          }
          memcpy((void *)(lVar15 * __n + (long)g_data),(void *)(lVar13 * __n + (long)pvVar5),__n);
        }
      }
    }
    lVar10 = local_90 + 1;
  }
  pnga_release(IVar6,lo,&local_a8);
  if (local_d8 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  return IVar6;
}

Assistant:

Integer pnga_sprs_array_create_from_sparse(Integer s_a,
    Integer trans)
{
  Integer *map;
  Integer handle = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer g_a;
  Integer dims[2];
  Integer two = 2;
  Integer nblock[2];
  Integer idx_size = SPA[handle].idx_size;
  Integer ilo, ihi;
  Integer lo[2], hi[2], ld;
  Integer i, j, iblock;
  Integer elemsize = SPA[handle].size;
  void *g_data;
  void *s_data;
  char plus[2];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* allocate and fill map array to create new GA */
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs+1; i++) map[i] = 0;
  if (trans) {
    map[me+1] = SPA[handle].ilo+1;
  } else {
    map[me+1] = SPA[handle].ilo+1;
  }
  plus[0] = '+';
  plus[1] = '\0';
  if (sizeof(Integer) == 4) {
    pnga_pgroup_gop(SPA[handle].grp, C_INT, map, nprocs+1, plus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp, C_LONG, map, nprocs+1, plus);
  }
  if (trans) {
    map[0] = 1;
  } else {
    map[nprocs] = 1;
  }
  g_a = pnga_create_handle();
  dims[0] = SPA[handle].idim;
  dims[1] = SPA[handle].jdim;
  pnga_set_data(g_a,two,dims,SPA[handle].type);
  if (trans) {
    nblock[0] = 1;
    nblock[1] = nprocs;
  } else {
    nblock[0] = nprocs;
    nblock[1] = 1;
  }
  pnga_set_irreg_distr(g_a, map, nblock);
  if (!pnga_allocate(g_a)) {
    pnga_error("(ga_sprs_array_create_from_sparse) failed to create"
        " dense array",0);
  }
  free(map);
  /* Initialize global array to zero */
  pnga_zero(g_a);
  /* get limits of locally held row block */
  ilo = SPA[handle].ilo;
  ihi = SPA[handle].ihi;
  if (trans) {
    lo[0] = 1;
    hi[0] = SPA[handle].idim;
    lo[1] = ilo+1;
    hi[1] = ihi+1;
  } else {
    lo[0] = ilo+1;
    hi[0] = ihi+1;
    lo[1] = 1;
    hi[1] = SPA[handle].jdim;
  }
  pnga_access_ptr(g_a,lo,hi,&g_data,&ld);
  /* loop over all column blocks in row block and assign values to dense matrix */
  for (iblock=0; iblock<SPA[handle].nblocks; iblock++) {
    void *iptr, *jptr;
    int64_t *lidx, *ljdx;
    int *sidx, *sjdx;
    Integer idx, jdx, n;
    Integer jlo, jhi;
    n = SPA[handle].blkidx[iblock];
    pnga_sprs_array_column_distribution(s_a,n,&jlo,&jhi);
    pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&s_data);
    for (i=ilo; i<=ihi; i++) {
      Integer ncols;
      if (idx_size == 4) {
        sidx = (int*)iptr;
        sjdx = (int*)jptr;
        ncols =  (Integer)(sidx[i+1-ilo]-sidx[i-ilo]);
        for (j=0; j<ncols; j++) {
          jdx = sjdx[sidx[i-ilo]+j];
          if (trans) {
            memcpy(((char*)g_data+elemsize*((i-lo[1]+1)*ld+jdx-lo[0]+1)),
                ((char*)s_data+elemsize*(sidx[i-ilo]+j)),
                (size_t)elemsize);
          }  else {
            memcpy(((char*)g_data+elemsize*(i-lo[0]+1+ld*(jdx-lo[1]+1))),
                ((char*)s_data+elemsize*(sidx[i-ilo]+j)),
                (size_t)elemsize);
          }
        }
      } else {
        lidx = (int64_t*)iptr;
        ljdx = (int64_t*)jptr;
        ncols =  (Integer)(lidx[i+1-ilo]-lidx[i-ilo]);
        for (j=0; j<ncols; j++) {
          jdx = ljdx[lidx[i-ilo]+j];
          if (trans) {
            memcpy(((char*)g_data+elemsize*((i-lo[1]+1)*ld+jdx-lo[0]+1)),
                ((char*)s_data+elemsize*(lidx[i-ilo]+j)),
                (size_t)elemsize);
          }  else {
            memcpy(((char*)g_data+elemsize*(i-lo[0]+1+ld*(jdx-lo[1]+1))),
                ((char*)s_data+elemsize*(lidx[i-ilo]+j)),
                (size_t)elemsize);
          }
        }
      }
    }
  }
  pnga_release(g_a,lo,hi); 
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_a;
}